

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::genPointerArrays
          (string *__return_storage_ptr__,CppGenerator *this,string *rel,string *numOfJoinVars,
          bool parallelizeRelation)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined7 in_register_00000081;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0;
  long lStack_298;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if ((int)CONCAT71(in_register_00000081,parallelizeRelation) == 0) {
    local_110 = &local_100;
    std::__cxx11::string::_M_construct((ulong)&local_110,'\x06');
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_e0 = *plVar5;
      lStack_d8 = plVar2[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar5;
      local_f0 = (long *)*plVar2;
    }
    local_e8 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f0,(ulong)(rel->_M_dataplus)._M_p);
    local_1f0 = &local_1e0;
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_1e0 = *plVar5;
      lStack_1d8 = plVar2[3];
    }
    else {
      local_1e0 = *plVar5;
      local_1f0 = (long *)*plVar2;
    }
    local_1e8 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    local_1d0 = &local_1c0;
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_1c0 = *plVar5;
      lStack_1b8 = plVar2[3];
    }
    else {
      local_1c0 = *plVar5;
      local_1d0 = (long *)*plVar2;
    }
    local_1c8 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1d0,(ulong)(numOfJoinVars->_M_dataplus)._M_p);
    local_1b0 = &local_1a0;
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_1a0 = *plVar5;
      lStack_198 = plVar2[3];
    }
    else {
      local_1a0 = *plVar5;
      local_1b0 = (long *)*plVar2;
    }
    local_1a8 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b0);
    local_190 = &local_180;
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_180 = *plVar5;
      lStack_178 = plVar2[3];
    }
    else {
      local_180 = *plVar5;
      local_190 = (long *)*plVar2;
    }
    local_188 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_190);
    local_170 = &local_160;
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_160 = *plVar5;
      lStack_158 = plVar2[3];
    }
    else {
      local_160 = *plVar5;
      local_170 = (long *)*plVar2;
    }
    local_168 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_170,(ulong)(rel->_M_dataplus)._M_p);
    local_150 = &local_140;
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_140 = *plVar5;
      lStack_138 = plVar2[3];
    }
    else {
      local_140 = *plVar5;
      local_150 = (long *)*plVar2;
    }
    local_148 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_150);
    local_2b0 = &local_2a0;
    puVar4 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar4) {
      local_2a0 = *puVar4;
      lStack_298 = plVar2[3];
    }
    else {
      local_2a0 = *puVar4;
      local_2b0 = (ulong *)*plVar2;
    }
    local_2a8 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_2b0,(ulong)(numOfJoinVars->_M_dataplus)._M_p);
    local_250 = &local_240;
    puVar6 = puVar3 + 2;
    if ((undefined8 *)*puVar3 == puVar6) {
      local_240 = *puVar6;
      uStack_238 = puVar3[3];
    }
    else {
      local_240 = *puVar6;
      local_250 = (undefined8 *)*puVar3;
    }
    local_248 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_250);
    puVar4 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar4) {
      local_280 = *puVar4;
      lStack_278 = plVar2[3];
      local_290 = &local_280;
    }
    else {
      local_280 = *puVar4;
      local_290 = (ulong *)*plVar2;
    }
    local_288 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    local_270 = &local_260;
    std::__cxx11::string::_M_construct((ulong)&local_270,'\x06');
    uVar8 = 0xf;
    if (local_290 != &local_280) {
      uVar8 = local_280;
    }
    if (uVar8 < (ulong)(local_268 + local_288)) {
      uVar8 = 0xf;
      if (local_270 != &local_260) {
        uVar8 = local_260;
      }
      if (uVar8 < (ulong)(local_268 + local_288)) goto LAB_0022fada;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_0022fada:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_270);
    }
    local_230 = &local_220;
    puVar6 = puVar3 + 2;
    if ((undefined8 *)*puVar3 == puVar6) {
      local_220 = *puVar6;
      uStack_218 = puVar3[3];
    }
    else {
      local_220 = *puVar6;
      local_230 = (undefined8 *)*puVar3;
    }
    local_228 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
    puVar4 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar4) {
      local_120 = *puVar4;
      lStack_118 = puVar3[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *puVar4;
      local_130 = (ulong *)*puVar3;
    }
    local_128 = puVar3[1];
    *puVar3 = puVar4;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_130,(ulong)(rel->_M_dataplus)._M_p);
    puVar6 = puVar3 + 2;
    if ((undefined8 *)*puVar3 == puVar6) {
      local_200 = *puVar6;
      uStack_1f8 = puVar3[3];
      local_210 = &local_200;
    }
    else {
      local_200 = *puVar6;
      local_210 = (undefined8 *)*puVar3;
    }
    local_208 = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_210);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_c0 = *plVar5;
      lStack_b8 = plVar2[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar5;
      local_d0 = (long *)*plVar2;
    }
    local_c8 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(rel->_M_dataplus)._M_p);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_a0 = *plVar5;
      lStack_98 = plVar2[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar5;
      local_b0 = (long *)*plVar2;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar7) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    plVar2 = local_110;
    if (local_110 == &local_100) {
      return __return_storage_ptr__;
    }
    goto LAB_002300a3;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x06');
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  local_270 = &local_260;
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_260 = *puVar4;
    lStack_258 = plVar2[3];
  }
  else {
    local_260 = *puVar4;
    local_270 = (ulong *)*plVar2;
  }
  local_268 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)(rel->_M_dataplus)._M_p);
  local_110 = &local_100;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_100 = *plVar5;
    lStack_f8 = plVar2[3];
  }
  else {
    local_100 = *plVar5;
    local_110 = (long *)*plVar2;
  }
  local_108 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
  local_f0 = &local_e0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_e0 = *plVar2;
    lStack_d8 = puVar3[3];
  }
  else {
    local_e0 = *plVar2;
    local_f0 = (long *)*puVar3;
  }
  local_e8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_f0,(ulong)(numOfJoinVars->_M_dataplus)._M_p);
  local_1f0 = &local_1e0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_1e0 = *plVar2;
    lStack_1d8 = puVar3[3];
  }
  else {
    local_1e0 = *plVar2;
    local_1f0 = (long *)*puVar3;
  }
  local_1e8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
  local_1d0 = &local_1c0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_1c0 = *plVar2;
    lStack_1b8 = puVar3[3];
  }
  else {
    local_1c0 = *plVar2;
    local_1d0 = (long *)*puVar3;
  }
  local_1c8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
  local_1b0 = &local_1a0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_1a0 = *plVar2;
    lStack_198 = puVar3[3];
  }
  else {
    local_1a0 = *plVar2;
    local_1b0 = (long *)*puVar3;
  }
  local_1a8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)(rel->_M_dataplus)._M_p);
  local_190 = &local_180;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_180 = *plVar2;
    lStack_178 = puVar3[3];
  }
  else {
    local_180 = *plVar2;
    local_190 = (long *)*puVar3;
  }
  local_188 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
  local_170 = &local_160;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_160 = *plVar2;
    lStack_158 = puVar3[3];
  }
  else {
    local_160 = *plVar2;
    local_170 = (long *)*puVar3;
  }
  local_168 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_170,(ulong)(numOfJoinVars->_M_dataplus)._M_p);
  local_150 = &local_140;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_140 = *plVar2;
    lStack_138 = puVar3[3];
  }
  else {
    local_140 = *plVar2;
    local_150 = (long *)*puVar3;
  }
  local_148 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
  puVar4 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar4) {
    local_2a0 = *puVar4;
    lStack_298 = puVar3[3];
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *puVar4;
    local_2b0 = (ulong *)*puVar3;
  }
  local_2a8 = puVar3[1];
  *puVar3 = puVar4;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x06');
  uVar8 = 0xf;
  if (local_2b0 != &local_2a0) {
    uVar8 = local_2a0;
  }
  if (uVar8 < (ulong)(local_88 + local_2a8)) {
    uVar8 = 0xf;
    if (local_90 != local_80) {
      uVar8 = local_80[0];
    }
    if (uVar8 < (ulong)(local_88 + local_2a8)) goto LAB_0022fa46;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_2b0);
  }
  else {
LAB_0022fa46:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_90);
  }
  local_250 = &local_240;
  puVar6 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar6) {
    local_240 = *puVar6;
    uStack_238 = puVar3[3];
  }
  else {
    local_240 = *puVar6;
    local_250 = (undefined8 *)*puVar3;
  }
  local_248 = puVar3[1];
  *puVar3 = puVar6;
  puVar3[1] = 0;
  *(undefined1 *)puVar6 = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
  local_290 = &local_280;
  puVar4 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar4) {
    local_280 = *puVar4;
    lStack_278 = puVar3[3];
  }
  else {
    local_280 = *puVar4;
    local_290 = (ulong *)*puVar3;
  }
  local_288 = puVar3[1];
  *puVar3 = puVar4;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_290,(ulong)(rel->_M_dataplus)._M_p);
  local_230 = &local_220;
  puVar6 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar6) {
    local_220 = *puVar6;
    uStack_218 = puVar3[3];
  }
  else {
    local_220 = *puVar6;
    local_230 = (undefined8 *)*puVar3;
  }
  local_228 = puVar3[1];
  *puVar3 = puVar6;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_230);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_120 = *puVar4;
    lStack_118 = plVar2[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar4;
    local_130 = (ulong *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x06');
  uVar8 = 0xf;
  if (local_130 != &local_120) {
    uVar8 = local_120;
  }
  if (uVar8 < (ulong)(local_68 + local_128)) {
    uVar8 = 0xf;
    if (local_70 != local_60) {
      uVar8 = local_60[0];
    }
    if (uVar8 < (ulong)(local_68 + local_128)) goto LAB_0022fcd7;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0022fcd7:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_70);
  }
  local_210 = &local_200;
  puVar6 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar6) {
    local_200 = *puVar6;
    uStack_1f8 = puVar3[3];
  }
  else {
    local_200 = *puVar6;
    local_210 = (undefined8 *)*puVar3;
  }
  local_208 = puVar3[1];
  *puVar3 = puVar6;
  puVar3[1] = 0;
  *(undefined1 *)puVar6 = 0;
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_c0 = *plVar2;
    lStack_b8 = puVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar2;
    local_d0 = (long *)*puVar3;
  }
  local_c8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(rel->_M_dataplus)._M_p);
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_a0 = *plVar2;
    lStack_98 = puVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
    local_b0 = (long *)*puVar3;
  }
  local_a8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar7) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  plVar2 = local_50[0];
  if (local_50[0] == local_40) {
    return __return_storage_ptr__;
  }
LAB_002300a3:
  operator_delete(plVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genPointerArrays(const std::string& rel,
                                           std::string& numOfJoinVars,
                                           bool parallelizeRelation)
{
    if (parallelizeRelation)
        return offset(2)+"size_t lowerptr_"+rel+"["+numOfJoinVars+"] = {}, "+
            "upperptr_"+rel+"["+numOfJoinVars+"] = {}; \n"+
            offset(2)+"upperptr_"+rel+"[0] = upperptr;\n"+
            offset(2)+"lowerptr_"+rel+"[0] = lowerptr;\n";
    else
        return offset(2)+"size_t lowerptr_"+rel+"["+numOfJoinVars+"] = {}, "+
            "upperptr_"+rel+"["+numOfJoinVars+"] = {}; \n"+
            offset(2)+"upperptr_"+rel+"[0] = "+rel+".size()-1;\n";
}